

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::DescriptorPoolExtensionFinder::Find
          (DescriptorPoolExtensionFinder *this,int number,ExtensionInfo *output)

{
  MessageFactory *pMVar1;
  FieldDescriptor FVar2;
  Type TVar3;
  CppType CVar4;
  int iVar5;
  FieldOptions *this_00;
  Descriptor *pDVar6;
  undefined4 extraout_var;
  LogMessage *pLVar7;
  string *value;
  EnumDescriptor *pEVar8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  FieldDescriptor *local_30;
  FieldDescriptor *extension;
  ExtensionInfo *output_local;
  DescriptorPoolExtensionFinder *pDStack_18;
  int number_local;
  DescriptorPoolExtensionFinder *this_local;
  
  extension = (FieldDescriptor *)output;
  output_local._4_4_ = number;
  pDStack_18 = this;
  local_30 = DescriptorPool::FindExtensionByNumber(this->pool_,this->containing_type_,number);
  if (local_30 == (FieldDescriptor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    TVar3 = FieldDescriptor::type(local_30);
    *extension = SUB41(TVar3,0);
    FVar2 = (FieldDescriptor)FieldDescriptor::is_repeated(local_30);
    extension[1] = FVar2;
    this_00 = FieldDescriptor::options(local_30);
    FVar2 = (FieldDescriptor)FieldOptions::packed(this_00);
    extension[2] = FVar2;
    *(FieldDescriptor **)(extension + 0x18) = local_30;
    CVar4 = FieldDescriptor::cpp_type(local_30);
    if (CVar4 == CPPTYPE_MESSAGE) {
      pMVar1 = this->factory_;
      pDVar6 = FieldDescriptor::message_type(local_30);
      iVar5 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar6);
      *(ulong *)(extension + 8) = CONCAT44(extraout_var,iVar5);
      local_69 = 0;
      if (*(long *)(extension + 8) == 0) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x12d);
        local_69 = 1;
        pLVar7 = LogMessage::operator<<
                           (&local_68,"CHECK failed: output->message_prototype != NULL: ");
        pLVar7 = LogMessage::operator<<
                           (pLVar7,
                            "Extension factory\'s GetPrototype() returned NULL for extension: ");
        value = FieldDescriptor::full_name_abi_cxx11_(local_30);
        pLVar7 = LogMessage::operator<<(pLVar7,value);
        LogFinisher::operator=(local_7d,pLVar7);
      }
      if ((local_69 & 1) != 0) {
        LogMessage::~LogMessage(&local_68);
      }
    }
    else {
      CVar4 = FieldDescriptor::cpp_type(local_30);
      if (CVar4 == CPPTYPE_ENUM) {
        *(code **)(extension + 8) = ValidateEnumUsingDescriptor;
        pEVar8 = FieldDescriptor::enum_type(local_30);
        *(EnumDescriptor **)(extension + 0x10) = pEVar8;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorPoolExtensionFinder::Find(int number, ExtensionInfo* output) {
  const FieldDescriptor* extension =
      pool_->FindExtensionByNumber(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    output->type = extension->type();
    output->is_repeated = extension->is_repeated();
    output->is_packed = extension->options().packed();
    output->descriptor = extension;
    if (extension->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      output->message_prototype =
          factory_->GetPrototype(extension->message_type());
      GOOGLE_CHECK(output->message_prototype != NULL)
          << "Extension factory's GetPrototype() returned NULL for extension: "
          << extension->full_name();
    } else if (extension->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      output->enum_validity_check.func = ValidateEnumUsingDescriptor;
      output->enum_validity_check.arg = extension->enum_type();
    }

    return true;
  }
}